

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_ldm_countBackwardsMatch(BYTE *pIn,BYTE *pAnchor,BYTE *pMatch,BYTE *pMatchBase)

{
  long lVar1;
  
  for (lVar1 = 0;
      ((pMatchBase < pMatch + lVar1 && (pAnchor < pIn + lVar1)) &&
      (pIn[lVar1 + -1] == pMatch[lVar1 + -1])); lVar1 = lVar1 + -1) {
  }
  return -lVar1;
}

Assistant:

static size_t ZSTD_ldm_countBackwardsMatch(
            const BYTE* pIn, const BYTE* pAnchor,
            const BYTE* pMatch, const BYTE* pMatchBase)
{
    size_t matchLength = 0;
    while (pIn > pAnchor && pMatch > pMatchBase && pIn[-1] == pMatch[-1]) {
        pIn--;
        pMatch--;
        matchLength++;
    }
    return matchLength;
}